

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImg<float> * __thiscall cimg_library::CImg<float>::move_to(CImg<float> *this,CImg<float> *img)

{
  if ((this->_is_shared == false) && (img->_is_shared != true)) {
    swap(this,img);
  }
  else {
    assign(img,this->_data,this->_width,this->_height,this->_depth,this->_spectrum);
  }
  if ((this->_is_shared == false) && (this->_data != (float *)0x0)) {
    operator_delete__(this->_data);
  }
  this->_data = (float *)0x0;
  this->_width = 0;
  this->_height = 0;
  this->_depth = 0;
  this->_spectrum = 0;
  this->_is_shared = false;
  return img;
}

Assistant:

CImg<T>& move_to(CImg<T>& img) {
      if (_is_shared || img._is_shared) img.assign(*this);
      else swap(img);
      assign();
      return img;
    }